

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::BVHNIntersector1<8,_1,_true,_embree::avx2::SubGridIntersector1Pluecker<8,_true>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  uint uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  RTCIntersectArguments *pRVar48;
  Geometry *pGVar49;
  ulong *puVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined4 uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar80;
  undefined8 uVar81;
  float fVar85;
  float fVar86;
  undefined1 auVar82 [16];
  float fVar87;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  float fVar97;
  float fVar105;
  undefined1 auVar101 [16];
  float fVar104;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [32];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar103 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  float fVar120;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar125 [64];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar137 [32];
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar145 [64];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [32];
  float fVar152;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [64];
  UVIdentity<8> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_17f1;
  Ray *local_17f0;
  RayQueryContext *local_17e8;
  uint local_17dc;
  uint local_17d8;
  int local_17d4;
  ulong *local_17d0;
  ulong local_17c8;
  long local_17c0;
  long local_17b8;
  ulong local_17b0;
  ulong local_17a8;
  ulong local_17a0;
  long local_1798;
  ulong local_1790;
  ulong local_1788;
  ulong local_1780;
  ulong local_1778;
  ulong local_1770;
  ulong local_1768;
  ulong local_1760;
  long local_1758;
  long local_1750;
  Scene *local_1748;
  undefined8 local_1740;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  undefined1 local_1720 [32];
  float local_1700;
  float local_16fc;
  undefined4 local_16f8;
  undefined4 local_16f4;
  undefined4 local_16f0;
  undefined4 local_16ec;
  undefined4 local_16e8;
  uint local_16e4;
  uint local_16e0;
  RTCFilterFunctionNArguments local_16d0;
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [8];
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  undefined1 local_1460 [32];
  undefined4 local_1440;
  undefined4 uStack_143c;
  undefined4 uStack_1438;
  undefined4 uStack_1434;
  undefined4 uStack_1430;
  undefined4 uStack_142c;
  undefined4 uStack_1428;
  undefined4 uStack_1424;
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 *local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  ulong local_1200 [570];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar138 = ray->tfar;
    if (0.0 <= fVar138) {
      puVar50 = local_1200 + 1;
      aVar1 = (ray->dir).field_0;
      auVar11 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar88._8_4_ = 0x7fffffff;
      auVar88._0_8_ = 0x7fffffff7fffffff;
      auVar88._12_4_ = 0x7fffffff;
      auVar88 = vandps_avx((undefined1  [16])aVar1,auVar88);
      auVar98._8_4_ = 0x219392ef;
      auVar98._0_8_ = 0x219392ef219392ef;
      auVar98._12_4_ = 0x219392ef;
      auVar88 = vcmpps_avx(auVar88,auVar98,1);
      auVar99._8_4_ = 0x3f800000;
      auVar99._0_8_ = 0x3f8000003f800000;
      auVar99._12_4_ = 0x3f800000;
      auVar98 = vdivps_avx(auVar99,(undefined1  [16])aVar1);
      auVar100._8_4_ = 0x5d5e0b6b;
      auVar100._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar100._12_4_ = 0x5d5e0b6b;
      auVar88 = vblendvps_avx(auVar98,auVar100,auVar88);
      auVar89._0_4_ = auVar88._0_4_ * 0.99999964;
      auVar89._4_4_ = auVar88._4_4_ * 0.99999964;
      auVar89._8_4_ = auVar88._8_4_ * 0.99999964;
      auVar89._12_4_ = auVar88._12_4_ * 0.99999964;
      uVar61 = *(undefined4 *)&(ray->org).field_0;
      local_14a0._4_4_ = uVar61;
      local_14a0._0_4_ = uVar61;
      local_14a0._8_4_ = uVar61;
      local_14a0._12_4_ = uVar61;
      local_14a0._16_4_ = uVar61;
      local_14a0._20_4_ = uVar61;
      local_14a0._24_4_ = uVar61;
      local_14a0._28_4_ = uVar61;
      auVar125 = ZEXT3264(local_14a0);
      uVar61 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_14c0._4_4_ = uVar61;
      local_14c0._0_4_ = uVar61;
      local_14c0._8_4_ = uVar61;
      local_14c0._12_4_ = uVar61;
      local_14c0._16_4_ = uVar61;
      local_14c0._20_4_ = uVar61;
      local_14c0._24_4_ = uVar61;
      local_14c0._28_4_ = uVar61;
      auVar134 = ZEXT3264(local_14c0);
      auVar82._0_4_ = auVar88._0_4_ * 1.0000004;
      auVar82._4_4_ = auVar88._4_4_ * 1.0000004;
      auVar82._8_4_ = auVar88._8_4_ * 1.0000004;
      auVar82._12_4_ = auVar88._12_4_ * 1.0000004;
      uVar61 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_14e0._4_4_ = uVar61;
      local_14e0._0_4_ = uVar61;
      local_14e0._8_4_ = uVar61;
      local_14e0._12_4_ = uVar61;
      local_14e0._16_4_ = uVar61;
      local_14e0._20_4_ = uVar61;
      local_14e0._24_4_ = uVar61;
      local_14e0._28_4_ = uVar61;
      auVar136 = ZEXT3264(local_14e0);
      auVar88 = vmovshdup_avx(auVar89);
      uVar81 = auVar88._0_8_;
      local_1520._8_8_ = uVar81;
      local_1520._0_8_ = uVar81;
      local_1520._16_8_ = uVar81;
      local_1520._24_8_ = uVar81;
      auVar145 = ZEXT3264(local_1520);
      auVar99 = vshufpd_avx(auVar89,auVar89,1);
      auVar98 = vshufps_avx(auVar89,auVar89,0xaa);
      uVar81 = auVar98._0_8_;
      local_1540._8_8_ = uVar81;
      local_1540._0_8_ = uVar81;
      local_1540._16_8_ = uVar81;
      local_1540._24_8_ = uVar81;
      auVar150 = ZEXT3264(local_1540);
      auVar98 = vmovshdup_avx(auVar82);
      uVar81 = auVar98._0_8_;
      local_1580._8_8_ = uVar81;
      local_1580._0_8_ = uVar81;
      local_1580._16_8_ = uVar81;
      local_1580._24_8_ = uVar81;
      auVar153 = ZEXT3264(local_1580);
      auVar98 = vshufps_avx(auVar82,auVar82,0xaa);
      uVar81 = auVar98._0_8_;
      local_15e0._8_8_ = uVar81;
      local_15e0._0_8_ = uVar81;
      local_15e0._16_8_ = uVar81;
      local_15e0._24_8_ = uVar81;
      auVar96 = ZEXT3264(local_15e0);
      uVar51 = (ulong)(auVar89._0_4_ < 0.0) << 5;
      uVar52 = (ulong)(auVar88._0_4_ < 0.0) << 5 | 0x40;
      uVar53 = (ulong)(auVar99._0_4_ < 0.0) << 5 | 0x80;
      uVar54 = uVar51 ^ 0x20;
      uVar55 = uVar52 ^ 0x20;
      uVar61 = auVar11._0_4_;
      local_1620._4_4_ = uVar61;
      local_1620._0_4_ = uVar61;
      local_1620._8_4_ = uVar61;
      local_1620._12_4_ = uVar61;
      local_1620._16_4_ = uVar61;
      local_1620._20_4_ = uVar61;
      local_1620._24_4_ = uVar61;
      local_1620._28_4_ = uVar61;
      auVar119 = ZEXT3264(local_1620);
      local_1600._4_4_ = fVar138;
      local_1600._0_4_ = fVar138;
      local_1600._8_4_ = fVar138;
      local_1600._12_4_ = fVar138;
      local_1600._16_4_ = fVar138;
      local_1600._20_4_ = fVar138;
      local_1600._24_4_ = fVar138;
      local_1600._28_4_ = fVar138;
      auVar103 = ZEXT3264(local_1600);
      local_1768 = (ulong)(((uint)(auVar89._0_4_ < 0.0) << 5) >> 2);
      local_1770 = uVar54 >> 2;
      local_1778 = uVar52 >> 2;
      local_1780 = uVar55 >> 2;
      local_1788 = uVar53 >> 2;
      local_15c0._16_16_ = mm_lookupmask_ps._240_16_;
      local_15c0._0_16_ = mm_lookupmask_ps._240_16_;
      local_1460 = vperm2f128_avx(local_15c0,mm_lookupmask_ps._0_32_,2);
      local_1790 = (uVar53 ^ 0x20) >> 2;
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = 0x3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      auVar73._16_4_ = 0x3f800000;
      auVar73._20_4_ = 0x3f800000;
      auVar73._24_4_ = 0x3f800000;
      auVar73._28_4_ = 0x3f800000;
      auVar93._8_4_ = 0xbf800000;
      auVar93._0_8_ = 0xbf800000bf800000;
      auVar93._12_4_ = 0xbf800000;
      auVar93._16_4_ = 0xbf800000;
      auVar93._20_4_ = 0xbf800000;
      auVar93._24_4_ = 0xbf800000;
      auVar93._28_4_ = 0xbf800000;
      _local_1480 = vblendvps_avx(auVar73,auVar93,local_1460);
      local_17a8 = uVar51;
      local_1500 = auVar89._0_4_;
      fStack_14fc = auVar89._0_4_;
      fStack_14f8 = auVar89._0_4_;
      fStack_14f4 = auVar89._0_4_;
      fStack_14f0 = auVar89._0_4_;
      fStack_14ec = auVar89._0_4_;
      fStack_14e8 = auVar89._0_4_;
      fStack_14e4 = auVar89._0_4_;
      local_1560 = auVar82._0_4_;
      fStack_155c = auVar82._0_4_;
      fStack_1558 = auVar82._0_4_;
      fStack_1554 = auVar82._0_4_;
      fStack_1550 = auVar82._0_4_;
      fStack_154c = auVar82._0_4_;
      fStack_1548 = auVar82._0_4_;
      fStack_1544 = auVar82._0_4_;
      local_17b0 = uVar52;
      fVar138 = auVar89._0_4_;
      fVar139 = auVar89._0_4_;
      fVar140 = auVar89._0_4_;
      fVar141 = auVar89._0_4_;
      fVar142 = auVar89._0_4_;
      fVar143 = auVar89._0_4_;
      fVar80 = auVar82._0_4_;
      fVar85 = auVar82._0_4_;
      fVar86 = auVar82._0_4_;
      fVar87 = auVar82._0_4_;
      fVar97 = auVar82._0_4_;
      fVar104 = auVar82._0_4_;
      local_17f0 = ray;
      local_17e8 = context;
LAB_0153dcc4:
      if (puVar50 != local_1200) {
        uVar44 = puVar50[-1];
        puVar50 = puVar50 + -1;
        while ((uVar44 & 8) == 0) {
          auVar93 = vsubps_avx(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar51),auVar125._0_32_);
          auVar70._4_4_ = fVar138 * auVar93._4_4_;
          auVar70._0_4_ = auVar89._0_4_ * auVar93._0_4_;
          auVar70._8_4_ = fVar139 * auVar93._8_4_;
          auVar70._12_4_ = fVar140 * auVar93._12_4_;
          auVar70._16_4_ = fVar141 * auVar93._16_4_;
          auVar70._20_4_ = fVar142 * auVar93._20_4_;
          auVar70._24_4_ = fVar143 * auVar93._24_4_;
          auVar70._28_4_ = auVar93._28_4_;
          auVar93 = vsubps_avx(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar52),auVar134._0_32_);
          auVar94._4_4_ = auVar145._4_4_ * auVar93._4_4_;
          auVar94._0_4_ = auVar145._0_4_ * auVar93._0_4_;
          auVar94._8_4_ = auVar145._8_4_ * auVar93._8_4_;
          auVar94._12_4_ = auVar145._12_4_ * auVar93._12_4_;
          auVar94._16_4_ = auVar145._16_4_ * auVar93._16_4_;
          auVar94._20_4_ = auVar145._20_4_ * auVar93._20_4_;
          auVar94._24_4_ = auVar145._24_4_ * auVar93._24_4_;
          auVar94._28_4_ = auVar93._28_4_;
          auVar93 = vmaxps_avx(auVar70,auVar94);
          auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar53),auVar136._0_32_);
          auVar15._4_4_ = auVar150._4_4_ * auVar73._4_4_;
          auVar15._0_4_ = auVar150._0_4_ * auVar73._0_4_;
          auVar15._8_4_ = auVar150._8_4_ * auVar73._8_4_;
          auVar15._12_4_ = auVar150._12_4_ * auVar73._12_4_;
          auVar15._16_4_ = auVar150._16_4_ * auVar73._16_4_;
          auVar15._20_4_ = auVar150._20_4_ * auVar73._20_4_;
          auVar15._24_4_ = auVar150._24_4_ * auVar73._24_4_;
          auVar15._28_4_ = auVar73._28_4_;
          auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar54),auVar125._0_32_);
          auVar115._4_4_ = fVar80 * auVar73._4_4_;
          auVar115._0_4_ = auVar82._0_4_ * auVar73._0_4_;
          auVar115._8_4_ = fVar85 * auVar73._8_4_;
          auVar115._12_4_ = fVar86 * auVar73._12_4_;
          auVar115._16_4_ = fVar87 * auVar73._16_4_;
          auVar115._20_4_ = fVar97 * auVar73._20_4_;
          auVar115._24_4_ = fVar104 * auVar73._24_4_;
          auVar115._28_4_ = auVar73._28_4_;
          auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar55),auVar134._0_32_);
          auVar16._4_4_ = auVar153._4_4_ * auVar73._4_4_;
          auVar16._0_4_ = auVar153._0_4_ * auVar73._0_4_;
          auVar16._8_4_ = auVar153._8_4_ * auVar73._8_4_;
          auVar16._12_4_ = auVar153._12_4_ * auVar73._12_4_;
          auVar16._16_4_ = auVar153._16_4_ * auVar73._16_4_;
          auVar16._20_4_ = auVar153._20_4_ * auVar73._20_4_;
          auVar16._24_4_ = auVar153._24_4_ * auVar73._24_4_;
          auVar16._28_4_ = auVar73._28_4_;
          auVar70 = vminps_avx(auVar115,auVar16);
          auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar44 + 0x40 + (uVar53 ^ 0x20)),
                               auVar136._0_32_);
          auVar17._4_4_ = auVar96._4_4_ * auVar73._4_4_;
          auVar17._0_4_ = auVar96._0_4_ * auVar73._0_4_;
          auVar17._8_4_ = auVar96._8_4_ * auVar73._8_4_;
          auVar17._12_4_ = auVar96._12_4_ * auVar73._12_4_;
          auVar17._16_4_ = auVar96._16_4_ * auVar73._16_4_;
          auVar17._20_4_ = auVar96._20_4_ * auVar73._20_4_;
          auVar17._24_4_ = auVar96._24_4_ * auVar73._24_4_;
          auVar17._28_4_ = auVar73._28_4_;
          auVar73 = vmaxps_avx(auVar15,auVar119._0_32_);
          auVar93 = vmaxps_avx(auVar93,auVar73);
          auVar73 = vminps_avx(auVar17,auVar103._0_32_);
          auVar73 = vminps_avx(auVar70,auVar73);
          auVar93 = vcmpps_avx(auVar93,auVar73,2);
          uVar41 = vmovmskps_avx(auVar93);
          if (uVar41 == 0) goto LAB_0153dcc4;
          uVar41 = uVar41 & 0xff;
          uVar42 = uVar44 & 0xfffffffffffffff0;
          lVar43 = 0;
          for (uVar44 = (ulong)uVar41; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000)
          {
            lVar43 = lVar43 + 1;
          }
          uVar44 = *(ulong *)(uVar42 + lVar43 * 8);
          uVar41 = uVar41 - 1 & uVar41;
          uVar45 = (ulong)uVar41;
          if (uVar41 != 0) {
            do {
              *puVar50 = uVar44;
              puVar50 = puVar50 + 1;
              lVar43 = 0;
              for (uVar44 = uVar45; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                lVar43 = lVar43 + 1;
              }
              uVar45 = uVar45 - 1 & uVar45;
              uVar44 = *(ulong *)(uVar42 + lVar43 * 8);
            } while (uVar45 != 0);
          }
        }
        uVar42 = uVar44 & 0xfffffffffffffff0;
        local_17d0 = puVar50;
        local_17c0 = (ulong)((uint)uVar44 & 0xf) - 8;
        for (local_17b8 = 0; local_17b8 != local_17c0; local_17b8 = local_17b8 + 1) {
          lVar43 = local_17b8 * 0x90;
          local_1798 = uVar42 + lVar43;
          uVar61 = *(undefined4 *)(uVar42 + 0x70 + lVar43);
          auVar63._4_4_ = uVar61;
          auVar63._0_4_ = uVar61;
          auVar63._8_4_ = uVar61;
          auVar63._12_4_ = uVar61;
          auVar63._16_4_ = uVar61;
          auVar63._20_4_ = uVar61;
          auVar63._24_4_ = uVar61;
          auVar63._28_4_ = uVar61;
          uVar61 = *(undefined4 *)(uVar42 + 0x7c + lVar43);
          auVar74._4_4_ = uVar61;
          auVar74._0_4_ = uVar61;
          auVar74._8_4_ = uVar61;
          auVar74._12_4_ = uVar61;
          auVar74._16_4_ = uVar61;
          auVar74._20_4_ = uVar61;
          auVar74._24_4_ = uVar61;
          auVar74._28_4_ = uVar61;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)(local_1768 + 0x40 + local_1798);
          auVar93 = vpmovzxbd_avx2(auVar11);
          auVar93 = vcvtdq2ps_avx(auVar93);
          auVar11 = vfmadd213ps_fma(auVar93,auVar74,auVar63);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(local_1770 + 0x40 + local_1798);
          auVar93 = vpmovzxbd_avx2(auVar3);
          auVar93 = vcvtdq2ps_avx(auVar93);
          auVar99 = vfmadd213ps_fma(auVar93,auVar74,auVar63);
          uVar61 = *(undefined4 *)(uVar42 + 0x74 + lVar43);
          auVar64._4_4_ = uVar61;
          auVar64._0_4_ = uVar61;
          auVar64._8_4_ = uVar61;
          auVar64._12_4_ = uVar61;
          auVar64._16_4_ = uVar61;
          auVar64._20_4_ = uVar61;
          auVar64._24_4_ = uVar61;
          auVar64._28_4_ = uVar61;
          uVar61 = *(undefined4 *)(uVar42 + 0x80 + lVar43);
          auVar75._4_4_ = uVar61;
          auVar75._0_4_ = uVar61;
          auVar75._8_4_ = uVar61;
          auVar75._12_4_ = uVar61;
          auVar75._16_4_ = uVar61;
          auVar75._20_4_ = uVar61;
          auVar75._24_4_ = uVar61;
          auVar75._28_4_ = uVar61;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_1778 + 0x40 + local_1798);
          auVar93 = vpmovzxbd_avx2(auVar4);
          auVar93 = vcvtdq2ps_avx(auVar93);
          auVar100 = vfmadd213ps_fma(auVar93,auVar75,auVar64);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_1780 + 0x40 + local_1798);
          auVar93 = vpmovzxbd_avx2(auVar5);
          auVar93 = vcvtdq2ps_avx(auVar93);
          auVar3 = vfmadd213ps_fma(auVar93,auVar75,auVar64);
          uVar61 = *(undefined4 *)(uVar42 + 0x78 + lVar43);
          auVar65._4_4_ = uVar61;
          auVar65._0_4_ = uVar61;
          auVar65._8_4_ = uVar61;
          auVar65._12_4_ = uVar61;
          auVar65._16_4_ = uVar61;
          auVar65._20_4_ = uVar61;
          auVar65._24_4_ = uVar61;
          auVar65._28_4_ = uVar61;
          uVar61 = *(undefined4 *)(uVar42 + 0x84 + lVar43);
          auVar76._4_4_ = uVar61;
          auVar76._0_4_ = uVar61;
          auVar76._8_4_ = uVar61;
          auVar76._12_4_ = uVar61;
          auVar76._16_4_ = uVar61;
          auVar76._20_4_ = uVar61;
          auVar76._24_4_ = uVar61;
          auVar76._28_4_ = uVar61;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(local_1788 + 0x40 + local_1798);
          auVar93 = vpmovzxbd_avx2(auVar6);
          auVar93 = vcvtdq2ps_avx(auVar93);
          auVar4 = vfmadd213ps_fma(auVar93,auVar76,auVar65);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(local_1790 + 0x40 + local_1798);
          auVar93 = vpmovzxbd_avx2(auVar7);
          auVar93 = vcvtdq2ps_avx(auVar93);
          auVar5 = vfmadd213ps_fma(auVar93,auVar76,auVar65);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)(uVar42 + 0x40 + lVar43);
          auVar72._8_8_ = 0;
          auVar72._0_8_ = *(ulong *)(uVar42 + 0x48 + lVar43);
          auVar88 = vpminub_avx(auVar62,auVar72);
          auVar98 = vpcmpeqb_avx(auVar62,auVar88);
          auVar93 = vsubps_avx(ZEXT1632(auVar11),auVar125._0_32_);
          auVar18._4_4_ = fVar138 * auVar93._4_4_;
          auVar18._0_4_ = auVar89._0_4_ * auVar93._0_4_;
          auVar18._8_4_ = fVar139 * auVar93._8_4_;
          auVar18._12_4_ = fVar140 * auVar93._12_4_;
          auVar18._16_4_ = fVar141 * auVar93._16_4_;
          auVar18._20_4_ = fVar142 * auVar93._20_4_;
          auVar18._24_4_ = fVar143 * auVar93._24_4_;
          auVar18._28_4_ = auVar93._28_4_;
          auVar93 = vsubps_avx(ZEXT1632(auVar100),auVar134._0_32_);
          auVar19._4_4_ = auVar145._4_4_ * auVar93._4_4_;
          auVar19._0_4_ = auVar145._0_4_ * auVar93._0_4_;
          auVar19._8_4_ = auVar145._8_4_ * auVar93._8_4_;
          auVar19._12_4_ = auVar145._12_4_ * auVar93._12_4_;
          auVar19._16_4_ = auVar145._16_4_ * auVar93._16_4_;
          auVar19._20_4_ = auVar145._20_4_ * auVar93._20_4_;
          auVar19._24_4_ = auVar145._24_4_ * auVar93._24_4_;
          auVar19._28_4_ = auVar93._28_4_;
          auVar93 = vmaxps_avx(auVar18,auVar19);
          auVar73 = vsubps_avx(ZEXT1632(auVar99),auVar125._0_32_);
          auVar20._4_4_ = fVar80 * auVar73._4_4_;
          auVar20._0_4_ = auVar82._0_4_ * auVar73._0_4_;
          auVar20._8_4_ = fVar85 * auVar73._8_4_;
          auVar20._12_4_ = fVar86 * auVar73._12_4_;
          auVar20._16_4_ = fVar87 * auVar73._16_4_;
          auVar20._20_4_ = fVar97 * auVar73._20_4_;
          auVar20._24_4_ = fVar104 * auVar73._24_4_;
          auVar20._28_4_ = auVar73._28_4_;
          auVar73 = vsubps_avx(ZEXT1632(auVar3),auVar134._0_32_);
          auVar21._4_4_ = auVar153._4_4_ * auVar73._4_4_;
          auVar21._0_4_ = auVar153._0_4_ * auVar73._0_4_;
          auVar21._8_4_ = auVar153._8_4_ * auVar73._8_4_;
          auVar21._12_4_ = auVar153._12_4_ * auVar73._12_4_;
          auVar21._16_4_ = auVar153._16_4_ * auVar73._16_4_;
          auVar21._20_4_ = auVar153._20_4_ * auVar73._20_4_;
          auVar21._24_4_ = auVar153._24_4_ * auVar73._24_4_;
          auVar21._28_4_ = auVar73._28_4_;
          auVar70 = vminps_avx(auVar20,auVar21);
          auVar73 = vsubps_avx(ZEXT1632(auVar4),auVar136._0_32_);
          auVar22._4_4_ = auVar150._4_4_ * auVar73._4_4_;
          auVar22._0_4_ = auVar150._0_4_ * auVar73._0_4_;
          auVar22._8_4_ = auVar150._8_4_ * auVar73._8_4_;
          auVar22._12_4_ = auVar150._12_4_ * auVar73._12_4_;
          auVar22._16_4_ = auVar150._16_4_ * auVar73._16_4_;
          auVar22._20_4_ = auVar150._20_4_ * auVar73._20_4_;
          auVar22._24_4_ = auVar150._24_4_ * auVar73._24_4_;
          auVar22._28_4_ = auVar73._28_4_;
          auVar73 = vmaxps_avx(auVar22,local_1620);
          auVar93 = vmaxps_avx(auVar93,auVar73);
          auVar73 = vsubps_avx(ZEXT1632(auVar5),auVar136._0_32_);
          auVar23._4_4_ = local_15e0._4_4_ * auVar73._4_4_;
          auVar23._0_4_ = local_15e0._0_4_ * auVar73._0_4_;
          auVar23._8_4_ = local_15e0._8_4_ * auVar73._8_4_;
          auVar23._12_4_ = local_15e0._12_4_ * auVar73._12_4_;
          auVar23._16_4_ = local_15e0._16_4_ * auVar73._16_4_;
          auVar23._20_4_ = local_15e0._20_4_ * auVar73._20_4_;
          auVar23._24_4_ = local_15e0._24_4_ * auVar73._24_4_;
          auVar23._28_4_ = auVar73._28_4_;
          auVar73 = vminps_avx(auVar23,local_1600);
          auVar73 = vminps_avx(auVar70,auVar73);
          auVar93 = vcmpps_avx(auVar93,auVar73,2);
          auVar88 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
          auVar98 = vpmovzxbw_avx(auVar98);
          auVar88 = vpand_avx(auVar88,auVar98);
          auVar88 = vpshufb_avx(auVar88,_DAT_01fb8680);
          uVar44 = (ulong)(byte)(SUB161(auVar88 >> 7,0) & 1 | (SUB161(auVar88 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar88 >> 0x3f,0) << 7);
          while( true ) {
            auVar103 = ZEXT3264(local_1600);
            auVar96 = ZEXT3264(local_15e0);
            if (uVar44 == 0) break;
            local_1760 = uVar44;
            lVar43 = 0;
            for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
              lVar43 = lVar43 + 1;
            }
            uVar8 = *(ushort *)(local_1798 + lVar43 * 8);
            uVar9 = *(ushort *)(local_1798 + 2 + lVar43 * 8);
            local_17c8 = (ulong)*(uint *)(local_1798 + 0x88);
            local_17a0 = (ulong)*(uint *)(local_1798 + 4 + lVar43 * 8);
            local_1748 = context->scene;
            pGVar49 = (local_1748->geometries).items[local_17c8].ptr;
            local_1750 = *(long *)&pGVar49->field_0x58;
            local_1758 = pGVar49[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i * local_17a0;
            local_17d8 = uVar8 & 0x7fff;
            local_17dc = uVar9 & 0x7fff;
            uVar41 = *(uint *)(local_1750 + 4 + local_1758);
            uVar44 = (ulong)uVar41;
            uVar52 = (ulong)(uVar41 * local_17dc + *(int *)(local_1750 + local_1758) + local_17d8);
            lVar43 = *(long *)&pGVar49[1].time_range.upper;
            p_Var10 = pGVar49[1].intersectionFilterN;
            auVar88 = *(undefined1 (*) [16])(lVar43 + (uVar52 + 1) * (long)p_Var10);
            auVar98 = *(undefined1 (*) [16])(lVar43 + (uVar52 + uVar44) * (long)p_Var10);
            lVar46 = uVar52 + uVar44 + 1;
            auVar11 = *(undefined1 (*) [16])(lVar43 + lVar46 * (long)p_Var10);
            auVar99 = *(undefined1 (*) [16])
                       (lVar43 + (uVar52 + (-1 < (short)uVar8) + 1) * (long)p_Var10);
            lVar47 = (ulong)(-1 < (short)uVar8) + lVar46;
            uVar51 = 0;
            if (-1 < (short)uVar9) {
              uVar51 = uVar44;
            }
            auVar82 = *(undefined1 (*) [16])(lVar43 + lVar47 * (long)p_Var10);
            auVar89 = *(undefined1 (*) [16])(lVar43 + (uVar52 + uVar44 + uVar51) * (long)p_Var10);
            auVar100 = *(undefined1 (*) [16])(lVar43 + (lVar46 + uVar51) * (long)p_Var10);
            auVar121._16_16_ = *(undefined1 (*) [16])(lVar43 + (uVar51 + lVar47) * (long)p_Var10);
            auVar121._0_16_ = auVar11;
            auVar4 = vunpcklps_avx(auVar88,auVar82);
            auVar3 = vunpckhps_avx(auVar88,auVar82);
            auVar5 = vunpcklps_avx(auVar99,auVar11);
            auVar99 = vunpckhps_avx(auVar99,auVar11);
            auVar6 = vunpcklps_avx(auVar3,auVar99);
            auVar7 = vunpcklps_avx(auVar4,auVar5);
            auVar99 = vunpckhps_avx(auVar4,auVar5);
            auVar4 = vunpcklps_avx(auVar98,auVar100);
            auVar3 = vunpckhps_avx(auVar98,auVar100);
            auVar5 = vunpcklps_avx(auVar11,auVar89);
            auVar89 = vunpckhps_avx(auVar11,auVar89);
            auVar3 = vunpcklps_avx(auVar3,auVar89);
            auVar62 = vunpcklps_avx(auVar4,auVar5);
            auVar89 = vunpckhps_avx(auVar4,auVar5);
            auVar77._16_16_ = auVar100;
            auVar77._0_16_ = auVar98;
            auVar66._16_16_ = auVar82;
            auVar66._0_16_ = auVar88;
            auVar93 = vunpcklps_avx(auVar66,auVar77);
            auVar56._16_16_ = auVar11;
            auVar56._0_16_ = *(undefined1 (*) [16])(lVar43 + (long)p_Var10 * uVar52);
            auVar73 = vunpcklps_avx(auVar56,auVar121);
            auVar94 = vunpcklps_avx(auVar73,auVar93);
            auVar93 = vunpckhps_avx(auVar73,auVar93);
            auVar73 = vunpckhps_avx(auVar66,auVar77);
            auVar70 = vunpckhps_avx(auVar56,auVar121);
            auVar73 = vunpcklps_avx(auVar70,auVar73);
            auVar67._16_16_ = auVar7;
            auVar67._0_16_ = auVar7;
            auVar57._16_16_ = auVar99;
            auVar57._0_16_ = auVar99;
            auVar90._16_16_ = auVar6;
            auVar90._0_16_ = auVar6;
            auVar122._16_16_ = auVar62;
            auVar122._0_16_ = auVar62;
            auVar132._16_16_ = auVar89;
            auVar132._0_16_ = auVar89;
            uVar61 = *(undefined4 *)&(local_17f0->org).field_0;
            auVar135._4_4_ = uVar61;
            auVar135._0_4_ = uVar61;
            auVar135._8_4_ = uVar61;
            auVar135._12_4_ = uVar61;
            auVar135._16_4_ = uVar61;
            auVar135._20_4_ = uVar61;
            auVar135._24_4_ = uVar61;
            auVar135._28_4_ = uVar61;
            uVar61 = *(undefined4 *)((long)&(local_17f0->org).field_0 + 4);
            auVar137._4_4_ = uVar61;
            auVar137._0_4_ = uVar61;
            auVar137._8_4_ = uVar61;
            auVar137._12_4_ = uVar61;
            auVar137._16_4_ = uVar61;
            auVar137._20_4_ = uVar61;
            auVar137._24_4_ = uVar61;
            auVar137._28_4_ = uVar61;
            auVar110._16_16_ = auVar3;
            auVar110._0_16_ = auVar3;
            uVar61 = *(undefined4 *)((long)&(local_17f0->org).field_0 + 8);
            auVar149._4_4_ = uVar61;
            auVar149._0_4_ = uVar61;
            auVar149._8_4_ = uVar61;
            auVar149._12_4_ = uVar61;
            auVar149._16_4_ = uVar61;
            auVar149._20_4_ = uVar61;
            auVar149._24_4_ = uVar61;
            auVar149._28_4_ = uVar61;
            local_1680 = vsubps_avx(auVar94,auVar135);
            local_1640 = vsubps_avx(auVar93,auVar137);
            local_1380 = vsubps_avx(auVar73,auVar149);
            auVar93 = vsubps_avx(auVar67,auVar135);
            auVar73 = vsubps_avx(auVar57,auVar137);
            auVar70 = vsubps_avx(auVar90,auVar149);
            auVar94 = vsubps_avx(auVar122,auVar135);
            auVar15 = vsubps_avx(auVar132,auVar137);
            auVar115 = vsubps_avx(auVar110,auVar149);
            local_13a0 = vsubps_avx(auVar94,local_1680);
            local_1660 = vsubps_avx(auVar15,local_1640);
            local_13c0 = vsubps_avx(auVar115,local_1380);
            auVar68._0_4_ = auVar94._0_4_ + local_1680._0_4_;
            auVar68._4_4_ = auVar94._4_4_ + local_1680._4_4_;
            auVar68._8_4_ = auVar94._8_4_ + local_1680._8_4_;
            auVar68._12_4_ = auVar94._12_4_ + local_1680._12_4_;
            auVar68._16_4_ = auVar94._16_4_ + local_1680._16_4_;
            auVar68._20_4_ = auVar94._20_4_ + local_1680._20_4_;
            auVar68._24_4_ = auVar94._24_4_ + local_1680._24_4_;
            auVar68._28_4_ = auVar94._28_4_ + local_1680._28_4_;
            auVar58._0_4_ = local_1640._0_4_ + auVar15._0_4_;
            auVar58._4_4_ = local_1640._4_4_ + auVar15._4_4_;
            auVar58._8_4_ = local_1640._8_4_ + auVar15._8_4_;
            auVar58._12_4_ = local_1640._12_4_ + auVar15._12_4_;
            auVar58._16_4_ = local_1640._16_4_ + auVar15._16_4_;
            auVar58._20_4_ = local_1640._20_4_ + auVar15._20_4_;
            auVar58._24_4_ = local_1640._24_4_ + auVar15._24_4_;
            auVar58._28_4_ = local_1640._28_4_ + auVar15._28_4_;
            fVar138 = local_1380._0_4_;
            auVar111._0_4_ = auVar115._0_4_ + fVar138;
            fVar139 = local_1380._4_4_;
            auVar111._4_4_ = auVar115._4_4_ + fVar139;
            fVar140 = local_1380._8_4_;
            auVar111._8_4_ = auVar115._8_4_ + fVar140;
            fVar141 = local_1380._12_4_;
            auVar111._12_4_ = auVar115._12_4_ + fVar141;
            fVar142 = local_1380._16_4_;
            auVar111._16_4_ = auVar115._16_4_ + fVar142;
            fVar143 = local_1380._20_4_;
            auVar111._20_4_ = auVar115._20_4_ + fVar143;
            auVar89._0_4_ = local_1380._24_4_;
            auVar111._24_4_ = auVar115._24_4_ + auVar89._0_4_;
            auVar111._28_4_ = auVar115._28_4_ + local_1380._28_4_;
            auVar24._4_4_ = local_13c0._4_4_ * auVar58._4_4_;
            auVar24._0_4_ = local_13c0._0_4_ * auVar58._0_4_;
            auVar24._8_4_ = local_13c0._8_4_ * auVar58._8_4_;
            auVar24._12_4_ = local_13c0._12_4_ * auVar58._12_4_;
            auVar24._16_4_ = local_13c0._16_4_ * auVar58._16_4_;
            auVar24._20_4_ = local_13c0._20_4_ * auVar58._20_4_;
            auVar24._24_4_ = local_13c0._24_4_ * auVar58._24_4_;
            auVar24._28_4_ = uVar61;
            auVar98 = vfmsub231ps_fma(auVar24,local_1660,auVar111);
            auVar25._4_4_ = local_13a0._4_4_ * auVar111._4_4_;
            auVar25._0_4_ = local_13a0._0_4_ * auVar111._0_4_;
            auVar25._8_4_ = local_13a0._8_4_ * auVar111._8_4_;
            auVar25._12_4_ = local_13a0._12_4_ * auVar111._12_4_;
            auVar25._16_4_ = local_13a0._16_4_ * auVar111._16_4_;
            auVar25._20_4_ = local_13a0._20_4_ * auVar111._20_4_;
            auVar25._24_4_ = local_13a0._24_4_ * auVar111._24_4_;
            auVar25._28_4_ = auVar111._28_4_;
            auVar88 = vfmsub231ps_fma(auVar25,local_13c0,auVar68);
            auVar26._4_4_ = local_1660._4_4_ * auVar68._4_4_;
            auVar26._0_4_ = local_1660._0_4_ * auVar68._0_4_;
            auVar26._8_4_ = local_1660._8_4_ * auVar68._8_4_;
            auVar26._12_4_ = local_1660._12_4_ * auVar68._12_4_;
            auVar26._16_4_ = local_1660._16_4_ * auVar68._16_4_;
            auVar26._20_4_ = local_1660._20_4_ * auVar68._20_4_;
            auVar26._24_4_ = local_1660._24_4_ * auVar68._24_4_;
            auVar26._28_4_ = auVar68._28_4_;
            auVar11 = vfmsub231ps_fma(auVar26,local_13a0,auVar58);
            uVar61 = *(undefined4 *)((long)&(local_17f0->dir).field_0 + 4);
            local_16a0._4_4_ = uVar61;
            local_16a0._0_4_ = uVar61;
            local_16a0._8_4_ = uVar61;
            local_16a0._12_4_ = uVar61;
            local_16a0._16_4_ = uVar61;
            local_16a0._20_4_ = uVar61;
            local_16a0._24_4_ = uVar61;
            local_16a0._28_4_ = uVar61;
            local_1740._4_4_ = (local_17f0->dir).field_0.m128[2];
            auVar69._0_4_ = local_1740._4_4_ * auVar11._0_4_;
            auVar69._4_4_ = local_1740._4_4_ * auVar11._4_4_;
            auVar69._8_4_ = local_1740._4_4_ * auVar11._8_4_;
            auVar69._12_4_ = local_1740._4_4_ * auVar11._12_4_;
            auVar69._16_4_ = local_1740._4_4_ * 0.0;
            auVar69._20_4_ = local_1740._4_4_ * 0.0;
            auVar69._24_4_ = local_1740._4_4_ * 0.0;
            auVar69._28_4_ = 0;
            auVar88 = vfmadd231ps_fma(auVar69,local_16a0,ZEXT1632(auVar88));
            uVar61 = *(undefined4 *)&(local_17f0->dir).field_0;
            local_1720._4_4_ = uVar61;
            local_1720._0_4_ = uVar61;
            local_1720._8_4_ = uVar61;
            local_1720._12_4_ = uVar61;
            local_1720._16_4_ = uVar61;
            local_1720._20_4_ = uVar61;
            local_1720._24_4_ = uVar61;
            local_1720._28_4_ = uVar61;
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),local_1720,ZEXT1632(auVar98));
            local_13e0 = vsubps_avx(local_1640,auVar73);
            local_1400 = vsubps_avx(local_1380,auVar70);
            auVar151._0_4_ = local_1640._0_4_ + auVar73._0_4_;
            auVar151._4_4_ = local_1640._4_4_ + auVar73._4_4_;
            auVar151._8_4_ = local_1640._8_4_ + auVar73._8_4_;
            auVar151._12_4_ = local_1640._12_4_ + auVar73._12_4_;
            auVar151._16_4_ = local_1640._16_4_ + auVar73._16_4_;
            auVar151._20_4_ = local_1640._20_4_ + auVar73._20_4_;
            auVar151._24_4_ = local_1640._24_4_ + auVar73._24_4_;
            auVar151._28_4_ = local_1640._28_4_ + auVar73._28_4_;
            auVar112._0_4_ = auVar70._0_4_ + fVar138;
            auVar112._4_4_ = auVar70._4_4_ + fVar139;
            auVar112._8_4_ = auVar70._8_4_ + fVar140;
            auVar112._12_4_ = auVar70._12_4_ + fVar141;
            auVar112._16_4_ = auVar70._16_4_ + fVar142;
            auVar112._20_4_ = auVar70._20_4_ + fVar143;
            auVar112._24_4_ = auVar70._24_4_ + auVar89._0_4_;
            auVar112._28_4_ = auVar70._28_4_ + local_1380._28_4_;
            fVar80 = local_1400._0_4_;
            fVar86 = local_1400._4_4_;
            auVar27._4_4_ = auVar151._4_4_ * fVar86;
            auVar27._0_4_ = auVar151._0_4_ * fVar80;
            fVar97 = local_1400._8_4_;
            auVar27._8_4_ = auVar151._8_4_ * fVar97;
            auVar82._0_4_ = local_1400._12_4_;
            auVar27._12_4_ = auVar151._12_4_ * auVar82._0_4_;
            fVar106 = local_1400._16_4_;
            auVar27._16_4_ = auVar151._16_4_ * fVar106;
            fVar108 = local_1400._20_4_;
            auVar27._20_4_ = auVar151._20_4_ * fVar108;
            fVar13 = local_1400._24_4_;
            auVar27._24_4_ = auVar151._24_4_ * fVar13;
            auVar27._28_4_ = local_13a0._28_4_;
            auVar11 = vfmsub231ps_fma(auVar27,local_13e0,auVar112);
            auVar16 = vsubps_avx(local_1680,auVar93);
            fVar85 = auVar16._0_4_;
            fVar87 = auVar16._4_4_;
            auVar28._4_4_ = auVar112._4_4_ * fVar87;
            auVar28._0_4_ = auVar112._0_4_ * fVar85;
            fVar104 = auVar16._8_4_;
            auVar28._8_4_ = auVar112._8_4_ * fVar104;
            fVar105 = auVar16._12_4_;
            auVar28._12_4_ = auVar112._12_4_ * fVar105;
            fVar107 = auVar16._16_4_;
            auVar28._16_4_ = auVar112._16_4_ * fVar107;
            fVar12 = auVar16._20_4_;
            auVar28._20_4_ = auVar112._20_4_ * fVar12;
            fVar14 = auVar16._24_4_;
            auVar28._24_4_ = auVar112._24_4_ * fVar14;
            auVar28._28_4_ = local_13c0._28_4_;
            auVar113._0_4_ = local_1680._0_4_ + auVar93._0_4_;
            auVar113._4_4_ = local_1680._4_4_ + auVar93._4_4_;
            auVar113._8_4_ = local_1680._8_4_ + auVar93._8_4_;
            auVar113._12_4_ = local_1680._12_4_ + auVar93._12_4_;
            auVar113._16_4_ = local_1680._16_4_ + auVar93._16_4_;
            auVar113._20_4_ = local_1680._20_4_ + auVar93._20_4_;
            auVar113._24_4_ = local_1680._24_4_ + auVar93._24_4_;
            auVar113._28_4_ = local_1680._28_4_ + auVar93._28_4_;
            auVar98 = vfmsub231ps_fma(auVar28,local_1400,auVar113);
            fVar152 = local_13e0._0_4_;
            fVar154 = local_13e0._4_4_;
            auVar29._4_4_ = fVar154 * auVar113._4_4_;
            auVar29._0_4_ = fVar152 * auVar113._0_4_;
            fVar155 = local_13e0._8_4_;
            auVar29._8_4_ = fVar155 * auVar113._8_4_;
            fVar156 = local_13e0._12_4_;
            auVar29._12_4_ = fVar156 * auVar113._12_4_;
            fVar157 = local_13e0._16_4_;
            auVar29._16_4_ = fVar157 * auVar113._16_4_;
            fVar158 = local_13e0._20_4_;
            auVar29._20_4_ = fVar158 * auVar113._20_4_;
            fVar159 = local_13e0._24_4_;
            auVar29._24_4_ = fVar159 * auVar113._24_4_;
            auVar29._28_4_ = auVar113._28_4_;
            auVar99 = vfmsub231ps_fma(auVar29,auVar16,auVar151);
            auVar114._0_4_ = local_1740._4_4_ * auVar99._0_4_;
            auVar114._4_4_ = local_1740._4_4_ * auVar99._4_4_;
            auVar114._8_4_ = local_1740._4_4_ * auVar99._8_4_;
            auVar114._12_4_ = local_1740._4_4_ * auVar99._12_4_;
            auVar114._16_4_ = local_1740._4_4_ * 0.0;
            auVar114._20_4_ = local_1740._4_4_ * 0.0;
            auVar114._24_4_ = local_1740._4_4_ * 0.0;
            auVar114._28_4_ = 0;
            auVar98 = vfmadd231ps_fma(auVar114,local_16a0,ZEXT1632(auVar98));
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),local_1720,ZEXT1632(auVar11));
            auVar17 = vsubps_avx(auVar93,auVar94);
            auVar116._0_4_ = auVar93._0_4_ + auVar94._0_4_;
            auVar116._4_4_ = auVar93._4_4_ + auVar94._4_4_;
            auVar116._8_4_ = auVar93._8_4_ + auVar94._8_4_;
            auVar116._12_4_ = auVar93._12_4_ + auVar94._12_4_;
            auVar116._16_4_ = auVar93._16_4_ + auVar94._16_4_;
            auVar116._20_4_ = auVar93._20_4_ + auVar94._20_4_;
            auVar116._24_4_ = auVar93._24_4_ + auVar94._24_4_;
            auVar116._28_4_ = auVar93._28_4_ + auVar94._28_4_;
            auVar94 = vsubps_avx(auVar73,auVar15);
            auVar91._0_4_ = auVar73._0_4_ + auVar15._0_4_;
            auVar91._4_4_ = auVar73._4_4_ + auVar15._4_4_;
            auVar91._8_4_ = auVar73._8_4_ + auVar15._8_4_;
            auVar91._12_4_ = auVar73._12_4_ + auVar15._12_4_;
            auVar91._16_4_ = auVar73._16_4_ + auVar15._16_4_;
            auVar91._20_4_ = auVar73._20_4_ + auVar15._20_4_;
            auVar91._24_4_ = auVar73._24_4_ + auVar15._24_4_;
            auVar91._28_4_ = auVar73._28_4_ + auVar15._28_4_;
            auVar15 = vsubps_avx(auVar70,auVar115);
            auVar83._0_4_ = auVar70._0_4_ + auVar115._0_4_;
            auVar83._4_4_ = auVar70._4_4_ + auVar115._4_4_;
            auVar83._8_4_ = auVar70._8_4_ + auVar115._8_4_;
            auVar83._12_4_ = auVar70._12_4_ + auVar115._12_4_;
            auVar83._16_4_ = auVar70._16_4_ + auVar115._16_4_;
            auVar83._20_4_ = auVar70._20_4_ + auVar115._20_4_;
            auVar83._24_4_ = auVar70._24_4_ + auVar115._24_4_;
            auVar83._28_4_ = auVar70._28_4_ + auVar115._28_4_;
            auVar123._0_4_ = auVar91._0_4_ * auVar15._0_4_;
            auVar123._4_4_ = auVar91._4_4_ * auVar15._4_4_;
            auVar123._8_4_ = auVar91._8_4_ * auVar15._8_4_;
            auVar123._12_4_ = auVar91._12_4_ * auVar15._12_4_;
            auVar123._16_4_ = auVar91._16_4_ * auVar15._16_4_;
            auVar123._20_4_ = auVar91._20_4_ * auVar15._20_4_;
            auVar123._24_4_ = auVar91._24_4_ * auVar15._24_4_;
            auVar123._28_4_ = 0;
            auVar99 = vfmsub231ps_fma(auVar123,auVar94,auVar83);
            auVar30._4_4_ = auVar83._4_4_ * auVar17._4_4_;
            auVar30._0_4_ = auVar83._0_4_ * auVar17._0_4_;
            auVar30._8_4_ = auVar83._8_4_ * auVar17._8_4_;
            auVar30._12_4_ = auVar83._12_4_ * auVar17._12_4_;
            auVar30._16_4_ = auVar83._16_4_ * auVar17._16_4_;
            auVar30._20_4_ = auVar83._20_4_ * auVar17._20_4_;
            auVar30._24_4_ = auVar83._24_4_ * auVar17._24_4_;
            auVar30._28_4_ = auVar83._28_4_;
            auVar11 = vfmsub231ps_fma(auVar30,auVar15,auVar116);
            auVar31._4_4_ = auVar116._4_4_ * auVar94._4_4_;
            auVar31._0_4_ = auVar116._0_4_ * auVar94._0_4_;
            auVar31._8_4_ = auVar116._8_4_ * auVar94._8_4_;
            auVar31._12_4_ = auVar116._12_4_ * auVar94._12_4_;
            auVar31._16_4_ = auVar116._16_4_ * auVar94._16_4_;
            auVar31._20_4_ = auVar116._20_4_ * auVar94._20_4_;
            auVar31._24_4_ = auVar116._24_4_ * auVar94._24_4_;
            auVar31._28_4_ = auVar116._28_4_;
            auVar100 = vfmsub231ps_fma(auVar31,auVar17,auVar91);
            local_1740._0_4_ = local_1740._4_4_;
            fStack_1738 = local_1740._4_4_;
            fStack_1734 = local_1740._4_4_;
            fStack_1730 = local_1740._4_4_;
            fStack_172c = local_1740._4_4_;
            fStack_1728 = local_1740._4_4_;
            fStack_1724 = local_1740._4_4_;
            auVar32._4_4_ = local_1740._4_4_ * auVar100._4_4_;
            auVar32._0_4_ = local_1740._4_4_ * auVar100._0_4_;
            auVar32._8_4_ = local_1740._4_4_ * auVar100._8_4_;
            auVar32._12_4_ = local_1740._4_4_ * auVar100._12_4_;
            auVar32._16_4_ = local_1740._4_4_ * 0.0;
            auVar32._20_4_ = local_1740._4_4_ * 0.0;
            auVar32._24_4_ = local_1740._4_4_ * 0.0;
            auVar32._28_4_ = auVar91._28_4_;
            auVar11 = vfmadd231ps_fma(auVar32,local_16a0,ZEXT1632(auVar11));
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_1720,ZEXT1632(auVar99));
            fVar144 = auVar11._0_4_ + auVar88._0_4_ + auVar98._0_4_;
            fVar146 = auVar11._4_4_ + auVar88._4_4_ + auVar98._4_4_;
            fVar147 = auVar11._8_4_ + auVar88._8_4_ + auVar98._8_4_;
            fVar148 = auVar11._12_4_ + auVar88._12_4_ + auVar98._12_4_;
            local_1320 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar147,CONCAT44(fVar146,fVar144))));
            auVar84._8_4_ = 0x7fffffff;
            auVar84._0_8_ = 0x7fffffff7fffffff;
            auVar84._12_4_ = 0x7fffffff;
            auVar84._16_4_ = 0x7fffffff;
            auVar84._20_4_ = 0x7fffffff;
            auVar84._24_4_ = 0x7fffffff;
            auVar84._28_4_ = 0x7fffffff;
            auVar70 = ZEXT1632(auVar88);
            auVar93 = vminps_avx(auVar70,ZEXT1632(auVar98));
            auVar93 = vminps_avx(auVar93,ZEXT1632(auVar11));
            local_15a0 = vandps_avx(local_1320,auVar84);
            fVar120 = local_15a0._0_4_ * 1.1920929e-07;
            fVar126 = local_15a0._4_4_ * 1.1920929e-07;
            auVar33._4_4_ = fVar126;
            auVar33._0_4_ = fVar120;
            fVar127 = local_15a0._8_4_ * 1.1920929e-07;
            auVar33._8_4_ = fVar127;
            fVar128 = local_15a0._12_4_ * 1.1920929e-07;
            auVar33._12_4_ = fVar128;
            fVar129 = local_15a0._16_4_ * 1.1920929e-07;
            auVar33._16_4_ = fVar129;
            fVar130 = local_15a0._20_4_ * 1.1920929e-07;
            auVar33._20_4_ = fVar130;
            fVar131 = local_15a0._24_4_ * 1.1920929e-07;
            auVar33._24_4_ = fVar131;
            auVar33._28_4_ = 0x34000000;
            auVar133._0_8_ = CONCAT44(fVar126,fVar120) ^ 0x8000000080000000;
            auVar133._8_4_ = -fVar127;
            auVar133._12_4_ = -fVar128;
            auVar133._16_4_ = -fVar129;
            auVar133._20_4_ = -fVar130;
            auVar133._24_4_ = -fVar131;
            auVar133._28_4_ = 0xb4000000;
            auVar93 = vcmpps_avx(auVar93,auVar133,5);
            auVar115 = ZEXT1632(auVar98);
            auVar73 = vmaxps_avx(auVar70,auVar115);
            auVar73 = vmaxps_avx(auVar73,ZEXT1632(auVar11));
            auVar73 = vcmpps_avx(auVar73,auVar33,2);
            local_1420 = vorps_avx(auVar93,auVar73);
            auVar73 = local_15c0 & local_1420;
            if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar73 >> 0x7f,0) != '\0') ||
                  (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar73 >> 0xbf,0) != '\0') ||
                (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar73[0x1f] < '\0') {
              local_1440 = 0x80000000;
              uStack_143c = 0x80000000;
              uStack_1438 = 0x80000000;
              uStack_1434 = 0x80000000;
              uStack_1430 = 0x80000000;
              uStack_142c = 0x80000000;
              uStack_1428 = 0x80000000;
              uStack_1424 = 0x80000000;
              auVar34._4_4_ = local_13c0._4_4_ * fVar154;
              auVar34._0_4_ = local_13c0._0_4_ * fVar152;
              auVar34._8_4_ = local_13c0._8_4_ * fVar155;
              auVar34._12_4_ = local_13c0._12_4_ * fVar156;
              auVar34._16_4_ = local_13c0._16_4_ * fVar157;
              auVar34._20_4_ = local_13c0._20_4_ * fVar158;
              auVar34._24_4_ = local_13c0._24_4_ * fVar159;
              auVar34._28_4_ = local_1420._28_4_;
              auVar35._4_4_ = local_1660._4_4_ * fVar87;
              auVar35._0_4_ = local_1660._0_4_ * fVar85;
              auVar35._8_4_ = local_1660._8_4_ * fVar104;
              auVar35._12_4_ = local_1660._12_4_ * fVar105;
              auVar35._16_4_ = local_1660._16_4_ * fVar107;
              auVar35._20_4_ = local_1660._20_4_ * fVar12;
              auVar35._24_4_ = local_1660._24_4_ * fVar14;
              auVar35._28_4_ = auVar93._28_4_;
              auVar88 = vfmsub213ps_fma(local_1660,local_1400,auVar34);
              auVar36._4_4_ = fVar86 * auVar94._4_4_;
              auVar36._0_4_ = fVar80 * auVar94._0_4_;
              auVar36._8_4_ = fVar97 * auVar94._8_4_;
              auVar36._12_4_ = auVar82._0_4_ * auVar94._12_4_;
              auVar36._16_4_ = fVar106 * auVar94._16_4_;
              auVar36._20_4_ = fVar108 * auVar94._20_4_;
              auVar36._24_4_ = fVar13 * auVar94._24_4_;
              auVar36._28_4_ = 0x34000000;
              local_1660 = local_1320;
              auVar37._4_4_ = fVar87 * auVar15._4_4_;
              auVar37._0_4_ = fVar85 * auVar15._0_4_;
              auVar37._8_4_ = fVar104 * auVar15._8_4_;
              auVar37._12_4_ = fVar105 * auVar15._12_4_;
              auVar37._16_4_ = fVar107 * auVar15._16_4_;
              auVar37._20_4_ = fVar12 * auVar15._20_4_;
              auVar37._24_4_ = fVar14 * auVar15._24_4_;
              auVar37._28_4_ = 0;
              auVar98 = vfmsub213ps_fma(auVar15,local_13e0,auVar36);
              auVar93 = vandps_avx(auVar34,auVar84);
              auVar73 = vandps_avx(auVar36,auVar84);
              auVar93 = vcmpps_avx(auVar93,auVar73,1);
              auVar15 = vblendvps_avx(ZEXT1632(auVar98),ZEXT1632(auVar88),auVar93);
              auVar38._4_4_ = fVar154 * auVar17._4_4_;
              auVar38._0_4_ = fVar152 * auVar17._0_4_;
              auVar38._8_4_ = fVar155 * auVar17._8_4_;
              auVar38._12_4_ = fVar156 * auVar17._12_4_;
              auVar38._16_4_ = fVar157 * auVar17._16_4_;
              auVar38._20_4_ = fVar158 * auVar17._20_4_;
              auVar38._24_4_ = fVar159 * auVar17._24_4_;
              auVar38._28_4_ = auVar93._28_4_;
              auVar88 = vfmsub213ps_fma(auVar17,local_1400,auVar37);
              auVar102._0_4_ = local_13a0._0_4_ * fVar80;
              auVar102._4_4_ = local_13a0._4_4_ * fVar86;
              auVar102._8_4_ = local_13a0._8_4_ * fVar97;
              auVar102._12_4_ = local_13a0._12_4_ * auVar82._0_4_;
              auVar102._16_4_ = local_13a0._16_4_ * fVar106;
              auVar102._20_4_ = local_13a0._20_4_ * fVar108;
              auVar102._24_4_ = local_13a0._24_4_ * fVar13;
              auVar102._28_4_ = 0;
              auVar98 = vfmsub213ps_fma(local_13c0,auVar16,auVar102);
              auVar93 = vandps_avx(auVar102,auVar84);
              auVar73 = vandps_avx(auVar37,auVar84);
              auVar93 = vcmpps_avx(auVar93,auVar73,1);
              auVar17 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar98),auVar93);
              auVar88 = vfmsub213ps_fma(local_13a0,local_13e0,auVar35);
              auVar98 = vfmsub213ps_fma(auVar94,auVar16,auVar38);
              auVar93 = vandps_avx(auVar35,auVar84);
              auVar73 = vandps_avx(auVar38,auVar84);
              auVar93 = vcmpps_avx(auVar93,auVar73,1);
              auVar93 = vblendvps_avx(ZEXT1632(auVar98),ZEXT1632(auVar88),auVar93);
              fVar97 = auVar93._0_4_;
              auVar59._0_4_ = fVar97 * local_1740._4_4_;
              fVar104 = auVar93._4_4_;
              auVar59._4_4_ = fVar104 * local_1740._4_4_;
              auVar82._0_4_ = auVar93._8_4_;
              auVar59._8_4_ = auVar82._0_4_ * local_1740._4_4_;
              fVar105 = auVar93._12_4_;
              auVar59._12_4_ = fVar105 * local_1740._4_4_;
              fVar106 = auVar93._16_4_;
              auVar59._16_4_ = fVar106 * local_1740._4_4_;
              fVar107 = auVar93._20_4_;
              auVar59._20_4_ = fVar107 * local_1740._4_4_;
              fVar108 = auVar93._24_4_;
              auVar59._24_4_ = fVar108 * local_1740._4_4_;
              auVar59._28_4_ = 0;
              auVar88 = vfmadd213ps_fma(local_16a0,auVar17,auVar59);
              auVar88 = vfmadd213ps_fma(local_1720,auVar15,ZEXT1632(auVar88));
              fVar80 = auVar88._0_4_ + auVar88._0_4_;
              fVar85 = auVar88._4_4_ + auVar88._4_4_;
              fVar86 = auVar88._8_4_ + auVar88._8_4_;
              fVar87 = auVar88._12_4_ + auVar88._12_4_;
              auVar94 = ZEXT1632(CONCAT412(fVar87,CONCAT48(fVar86,CONCAT44(fVar85,fVar80))));
              auVar60._0_4_ = fVar97 * fVar138;
              auVar60._4_4_ = fVar104 * fVar139;
              auVar60._8_4_ = auVar82._0_4_ * fVar140;
              auVar60._12_4_ = fVar105 * fVar141;
              auVar60._16_4_ = fVar106 * fVar142;
              auVar60._20_4_ = fVar107 * fVar143;
              auVar60._24_4_ = fVar108 * auVar89._0_4_;
              auVar60._28_4_ = 0;
              auVar88 = vfmadd213ps_fma(local_1640,auVar17,auVar60);
              auVar93 = vrcpps_avx(auVar94);
              auVar98 = vfmadd213ps_fma(local_1680,auVar15,ZEXT1632(auVar88));
              auVar124._8_4_ = 0x3f800000;
              auVar124._0_8_ = 0x3f8000003f800000;
              auVar124._12_4_ = 0x3f800000;
              auVar124._16_4_ = 0x3f800000;
              auVar124._20_4_ = 0x3f800000;
              auVar124._24_4_ = 0x3f800000;
              auVar124._28_4_ = 0x3f800000;
              auVar88 = vfnmadd213ps_fma(auVar93,auVar94,auVar124);
              auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar93,auVar93);
              local_1280._28_4_ = auVar93._28_4_;
              local_1280._0_28_ =
                   ZEXT1628(CONCAT412((auVar98._12_4_ + auVar98._12_4_) * auVar88._12_4_,
                                      CONCAT48((auVar98._8_4_ + auVar98._8_4_) * auVar88._8_4_,
                                               CONCAT44((auVar98._4_4_ + auVar98._4_4_) *
                                                        auVar88._4_4_,
                                                        (auVar98._0_4_ + auVar98._0_4_) *
                                                        auVar88._0_4_))));
              uVar61 = *(undefined4 *)((long)&(local_17f0->org).field_0 + 0xc);
              auVar92._4_4_ = uVar61;
              auVar92._0_4_ = uVar61;
              auVar92._8_4_ = uVar61;
              auVar92._12_4_ = uVar61;
              auVar92._16_4_ = uVar61;
              auVar92._20_4_ = uVar61;
              auVar92._24_4_ = uVar61;
              auVar92._28_4_ = uVar61;
              auVar93 = vcmpps_avx(auVar92,local_1280,2);
              fVar138 = local_17f0->tfar;
              auVar117._4_4_ = fVar138;
              auVar117._0_4_ = fVar138;
              auVar117._8_4_ = fVar138;
              auVar117._12_4_ = fVar138;
              auVar117._16_4_ = fVar138;
              auVar117._20_4_ = fVar138;
              auVar117._24_4_ = fVar138;
              auVar117._28_4_ = fVar138;
              auVar73 = vcmpps_avx(local_1280,auVar117,2);
              auVar93 = vandps_avx(auVar73,auVar93);
              auVar118._0_8_ = CONCAT44(fVar85,fVar80) ^ 0x8000000080000000;
              auVar118._8_4_ = -fVar86;
              auVar118._12_4_ = -fVar87;
              auVar118._16_4_ = 0x80000000;
              auVar118._20_4_ = 0x80000000;
              auVar118._24_4_ = 0x80000000;
              auVar118._28_4_ = 0x80000000;
              auVar73 = vcmpps_avx(auVar94,auVar118,4);
              auVar93 = vandps_avx(auVar73,auVar93);
              auVar73 = vandps_avx(local_1420,local_15c0);
              auVar93 = vpslld_avx2(auVar93,0x1f);
              auVar94 = vpsrad_avx2(auVar93,0x1f);
              auVar93 = auVar73 & auVar94;
              if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar93 >> 0x7f,0) != '\0') ||
                    (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar93 >> 0xbf,0) != '\0') ||
                  (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar93[0x1f] < '\0') {
                auVar2._0_4_ = local_17f0->tfar;
                auVar2._4_4_ = local_17f0->mask;
                auVar2._8_4_ = local_17f0->id;
                auVar2._12_4_ = local_17f0->flags;
                local_12e0 = vandps_avx(auVar94,auVar73);
                uVar41 = vextractps_avx(auVar2,1);
                local_1300 = &local_17f1;
                auVar93 = vsubps_avx(local_1320,auVar115);
                local_1360 = vblendvps_avx(auVar70,auVar93,local_1460);
                auVar93 = vsubps_avx(local_1320,auVar70);
                local_1340 = vblendvps_avx(auVar115,auVar93,local_1460);
                local_1260._0_4_ = auVar15._0_4_ * (float)local_1480._0_4_;
                local_1260._4_4_ = auVar15._4_4_ * (float)local_1480._4_4_;
                local_1260._8_4_ = auVar15._8_4_ * fStack_1478;
                local_1260._12_4_ = auVar15._12_4_ * fStack_1474;
                local_1260._16_4_ = auVar15._16_4_ * fStack_1470;
                local_1260._20_4_ = auVar15._20_4_ * fStack_146c;
                local_1260._24_4_ = auVar15._24_4_ * fStack_1468;
                local_1260._28_4_ = 0;
                local_1240[0] = (float)local_1480._0_4_ * auVar17._0_4_;
                local_1240[1] = (float)local_1480._4_4_ * auVar17._4_4_;
                local_1240[2] = fStack_1478 * auVar17._8_4_;
                local_1240[3] = fStack_1474 * auVar17._12_4_;
                fStack_1230 = fStack_1470 * auVar17._16_4_;
                fStack_122c = fStack_146c * auVar17._20_4_;
                fStack_1228 = fStack_1468 * auVar17._24_4_;
                uStack_1224 = auVar17._28_4_;
                local_1220._4_4_ = (float)local_1480._4_4_ * fVar104;
                local_1220._0_4_ = (float)local_1480._0_4_ * fVar97;
                local_1220._8_4_ = fStack_1478 * auVar82._0_4_;
                local_1220._12_4_ = fStack_1474 * fVar105;
                local_1220._16_4_ = fStack_1470 * fVar106;
                local_1220._20_4_ = fStack_146c * fVar107;
                local_1220._24_4_ = fStack_1468 * fVar108;
                local_1220._28_4_ = auVar17._28_4_;
                pGVar49 = (local_1748->geometries).items[local_17c8].ptr;
                if ((pGVar49->mask & uVar41) != 0) {
                  pRVar48 = local_17e8->args;
                  if ((pRVar48->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar49->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0153e928:
                    local_17f0->tfar = -INFINITY;
                    return;
                  }
                  auVar71._0_8_ = (ulong)CONCAT24(uVar8,(uint)uVar8) & 0x7fff00007fff;
                  auVar71._8_4_ = local_17d8;
                  auVar71._12_4_ = local_17d8;
                  auVar71._16_4_ = local_17d8;
                  auVar71._20_4_ = local_17d8;
                  auVar71._24_4_ = local_17d8;
                  auVar71._28_4_ = local_17d8;
                  auVar93 = vpaddd_avx2(auVar71,_DAT_01fb7740);
                  auVar78._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                  auVar78._8_4_ = local_17dc;
                  auVar78._12_4_ = local_17dc;
                  auVar78._16_4_ = local_17dc;
                  auVar78._20_4_ = local_17dc;
                  auVar78._24_4_ = local_17dc;
                  auVar78._28_4_ = local_17dc;
                  auVar101._0_4_ = (float)(int)(*(ushort *)(local_1750 + 8 + local_1758) - 1);
                  auVar101._4_12_ = auVar16._4_12_;
                  auVar70 = vpaddd_avx2(auVar78,_DAT_01fb7760);
                  auVar88 = vrcpss_avx(auVar101,auVar101);
                  auVar98 = vfnmadd213ss_fma(auVar101,auVar88,SUB6416(ZEXT464(0x40000000),0));
                  fVar138 = auVar88._0_4_ * auVar98._0_4_;
                  auVar109._0_4_ = (float)(int)(*(ushort *)(local_1750 + 10 + local_1758) - 1);
                  auVar109._4_12_ = auVar16._4_12_;
                  auVar88 = vrcpss_avx(auVar109,auVar109);
                  auVar98 = vfnmadd213ss_fma(auVar109,auVar88,SUB6416(ZEXT464(0x40000000),0));
                  fVar139 = auVar88._0_4_ * auVar98._0_4_;
                  auVar73 = vcvtdq2ps_avx(auVar93);
                  auVar70 = vcvtdq2ps_avx(auVar70);
                  auVar93 = vrcpps_avx(local_1320);
                  auVar95._8_4_ = 0x3f800000;
                  auVar95._0_8_ = 0x3f8000003f800000;
                  auVar95._12_4_ = 0x3f800000;
                  auVar95._16_4_ = 0x3f800000;
                  auVar95._20_4_ = 0x3f800000;
                  auVar95._24_4_ = 0x3f800000;
                  auVar95._28_4_ = 0x3f800000;
                  auVar88 = vfnmadd213ps_fma(local_1320,auVar93,auVar95);
                  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar93,auVar93);
                  auVar79._8_4_ = 0x219392ef;
                  auVar79._0_8_ = 0x219392ef219392ef;
                  auVar79._12_4_ = 0x219392ef;
                  auVar79._16_4_ = 0x219392ef;
                  auVar79._20_4_ = 0x219392ef;
                  auVar79._24_4_ = 0x219392ef;
                  auVar79._28_4_ = 0x219392ef;
                  auVar93 = vcmpps_avx(local_15a0,auVar79,5);
                  auVar93 = vandps_avx(ZEXT1632(auVar88),auVar93);
                  auVar39._4_4_ =
                       (fVar146 * auVar73._4_4_ + local_1360._4_4_) * fVar138 * auVar93._4_4_;
                  auVar39._0_4_ =
                       (fVar144 * auVar73._0_4_ + local_1360._0_4_) * fVar138 * auVar93._0_4_;
                  auVar39._8_4_ =
                       (fVar147 * auVar73._8_4_ + local_1360._8_4_) * fVar138 * auVar93._8_4_;
                  auVar39._12_4_ =
                       (fVar148 * auVar73._12_4_ + local_1360._12_4_) * fVar138 * auVar93._12_4_;
                  auVar39._16_4_ =
                       (auVar73._16_4_ * 0.0 + local_1360._16_4_) * fVar138 * auVar93._16_4_;
                  auVar39._20_4_ =
                       (auVar73._20_4_ * 0.0 + local_1360._20_4_) * fVar138 * auVar93._20_4_;
                  auVar39._24_4_ =
                       (auVar73._24_4_ * 0.0 + local_1360._24_4_) * fVar138 * auVar93._24_4_;
                  auVar39._28_4_ = auVar73._28_4_ + local_1360._28_4_;
                  local_12c0 = vminps_avx(auVar39,auVar95);
                  auVar40._4_4_ =
                       (fVar146 * auVar70._4_4_ + local_1340._4_4_) * fVar139 * auVar93._4_4_;
                  auVar40._0_4_ =
                       (fVar144 * auVar70._0_4_ + local_1340._0_4_) * fVar139 * auVar93._0_4_;
                  auVar40._8_4_ =
                       (fVar147 * auVar70._8_4_ + local_1340._8_4_) * fVar139 * auVar93._8_4_;
                  auVar40._12_4_ =
                       (fVar148 * auVar70._12_4_ + local_1340._12_4_) * fVar139 * auVar93._12_4_;
                  auVar40._16_4_ =
                       (auVar70._16_4_ * 0.0 + local_1340._16_4_) * fVar139 * auVar93._16_4_;
                  auVar40._20_4_ =
                       (auVar70._20_4_ * 0.0 + local_1340._20_4_) * fVar139 * auVar93._20_4_;
                  auVar40._24_4_ =
                       (auVar70._24_4_ * 0.0 + local_1340._24_4_) * fVar139 * auVar93._24_4_;
                  auVar40._28_4_ = auVar70._28_4_ + local_1340._28_4_;
                  local_12a0 = vminps_avx(auVar40,auVar95);
                  uVar41 = vmovmskps_avx(local_12e0);
                  lVar43 = 0;
                  uVar52 = (ulong)uVar41;
                  for (uVar51 = uVar52; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000
                      ) {
                    lVar43 = lVar43 + 1;
                  }
                  local_1740 = pRVar48;
                  local_1640._0_16_ = auVar2;
                  local_1680._0_8_ = pGVar49;
                  while (uVar52 != 0) {
                    local_1720._0_8_ = uVar52;
                    local_16f4 = *(undefined4 *)(local_12c0 + lVar43 * 4);
                    local_16f0 = *(undefined4 *)(local_12a0 + lVar43 * 4);
                    local_17f0->tfar = *(float *)(local_1280 + lVar43 * 4);
                    local_16d0.context = local_17e8->user;
                    local_1700 = local_1240[lVar43 + -8];
                    local_16fc = local_1240[lVar43];
                    local_16a0._0_8_ = lVar43;
                    local_16f8 = *(undefined4 *)(local_1220 + lVar43 * 4);
                    local_16ec = (undefined4)local_17a0;
                    local_16e8 = (undefined4)local_17c8;
                    local_16e4 = (local_16d0.context)->instID[0];
                    local_16e0 = (local_16d0.context)->instPrimID[0];
                    local_17d4 = -1;
                    local_16d0.valid = &local_17d4;
                    local_16d0.geometryUserPtr = pGVar49->userPtr;
                    local_16d0.ray = (RTCRayN *)local_17f0;
                    local_16d0.hit = (RTCHitN *)&local_1700;
                    local_16d0.N = 1;
                    if (pGVar49->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0153e7f3:
                      if ((pRVar48->filter == (RTCFilterFunctionN)0x0) ||
                         (((pRVar48->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_1680._0_8_ + 0x3e) & 0x40) == 0)))) goto LAB_0153e928;
                      (*pRVar48->filter)(&local_16d0);
                      if (*local_16d0.valid != 0) goto LAB_0153e928;
                    }
                    else {
                      (*pGVar49->occlusionFilterN)(&local_16d0);
                      pRVar48 = local_1740;
                      if (*local_16d0.valid != 0) goto LAB_0153e7f3;
                    }
                    local_17f0->tfar = (float)local_1640._0_4_;
                    lVar43 = 0;
                    uVar52 = local_1720._0_8_ ^ 1L << (local_16a0._0_8_ & 0x3f);
                    for (uVar51 = uVar52; (uVar51 & 1) == 0;
                        uVar51 = uVar51 >> 1 | 0x8000000000000000) {
                      lVar43 = lVar43 + 1;
                    }
                    pRVar48 = local_1740;
                    pGVar49 = (Geometry *)local_1680._0_8_;
                  }
                }
              }
            }
            uVar44 = local_1760 - 1 & local_1760;
            auVar125 = ZEXT3264(local_14a0);
            auVar134 = ZEXT3264(local_14c0);
            auVar136 = ZEXT3264(local_14e0);
            auVar145 = ZEXT3264(local_1520);
            auVar150 = ZEXT3264(local_1540);
            auVar153 = ZEXT3264(local_1580);
            context = local_17e8;
            puVar50 = local_17d0;
            uVar51 = local_17a8;
            uVar52 = local_17b0;
            auVar89._0_4_ = local_1500;
            fVar138 = fStack_14fc;
            fVar139 = fStack_14f8;
            fVar140 = fStack_14f4;
            fVar141 = fStack_14f0;
            fVar142 = fStack_14ec;
            fVar143 = fStack_14e8;
            auVar82._0_4_ = local_1560;
            fVar80 = fStack_155c;
            fVar85 = fStack_1558;
            fVar86 = fStack_1554;
            fVar87 = fStack_1550;
            fVar97 = fStack_154c;
            fVar104 = fStack_1548;
          }
          auVar119 = ZEXT3264(local_1620);
        }
        goto LAB_0153dcc4;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }